

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O1

bool __thiscall
FirewirePort::ReadQuadletNode
          (FirewirePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t *data,uchar param_4)

{
  uint uVar1;
  int iVar2;
  undefined7 in_register_00000081;
  bool bVar3;
  long *local_50 [2];
  long local_40 [2];
  
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"FirewirePort::ReadQuadlet","",data,
             CONCAT71(in_register_00000081,param_4));
  iVar2 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,(string *)local_50,0);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if ((char)iVar2 == '\0') {
    bVar3 = false;
  }
  else {
    iVar2 = raw1394_read(this->handle,node + this->baseNodeId,addr,4,data);
    bVar3 = iVar2 == 0;
    if (bVar3) {
      uVar1 = *data;
      *data = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      bVar3 = true;
    }
  }
  return bVar3;
}

Assistant:

bool FirewirePort::ReadQuadletNode(nodeid_t node, nodeaddr_t addr, quadlet_t &data, unsigned char)
{
    if (!CheckFwBusGeneration("FirewirePort::ReadQuadlet"))
        return false;

    bool ret = !raw1394_read(handle, baseNodeId+node, addr, 4, &data);
    if (ret)
        data = bswap_32(data);
    return ret;
}